

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

int Tas_ManSolve(Tas_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pObj2)

{
  int *piVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  s_Counter2 = 0;
  p->vModel->nSize = 0;
  pGVar2 = p->pAig->pObjs;
  uVar6 = 1;
  if (((pGVar2 != pObj2 && pGVar2 != pObj) && ((Gia_Obj_t *)((ulong)pObj2 ^ 1) != pObj)) &&
     (((Gia_Obj_t *)((ulong)pGVar2 ^ 1) != pObj ||
      (uVar6 = 0, pObj != pObj2 && pObj2 != (Gia_Obj_t *)0x0)))) {
    if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
      __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x55f,"int Tas_ManSolve(Tas_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
      __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x560,"int Tas_ManSolve(Tas_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
      __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x561,"int Tas_ManSolve(Tas_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    (p->Pars).nJustThis = 0;
    (p->Pars).nBTThis = 0;
    (p->Pars).nBTThisNc = 0;
    Tas_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    if ((pObj2 != (Gia_Obj_t *)0x0) &&
       ((*(byte *)(((ulong)pObj2 & 0xfffffffffffffffe) + 3) & 0x40) == 0)) {
      Tas_ManAssign(p,pObj2,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    }
    iVar4 = Tas_ManSolve_rec(p,0);
    uVar6 = 1;
    if (iVar4 == 0) {
      iVar4 = Tas_ManCheckLimits(p);
      if (iVar4 == 0) {
        Tas_ManSaveModel(p,p->vModel);
        uVar6 = 0;
      }
    }
    Tas_ManCancelUntil(p,0);
    (p->pJust).iHead = 0;
    (p->pJust).iTail = 0;
    (p->pClauses).iHead = 1;
    (p->pClauses).iTail = 1;
    iVar4 = 0;
    if (0 < p->nClauses) {
      (p->pStore).iCur = 0x10;
      for (iVar4 = 0; pVVar3 = p->vWatchLits, iVar4 < pVVar3->nSize; iVar4 = iVar4 + 1) {
        iVar5 = Vec_IntEntry(pVVar3,iVar4);
        p->pWatches[iVar5] = 0;
      }
      pVVar3->nSize = 0;
      p->nClauses = 0;
      iVar4 = 0;
    }
    for (; pVVar3 = p->vActiveVars, iVar4 < pVVar3->nSize; iVar4 = iVar4 + 1) {
      iVar5 = Vec_IntEntry(pVVar3,iVar4);
      p->pActivity[iVar5] = 0.0;
    }
    pVVar3->nSize = 0;
    iVar4 = (p->Pars).nJustThis;
    piVar1 = &(p->Pars).nBTTotal;
    *piVar1 = *piVar1 + (p->Pars).nBTThis;
    iVar5 = (p->Pars).nJustTotal;
    if (iVar4 < iVar5) {
      iVar4 = iVar5;
    }
    (p->Pars).nJustTotal = iVar4;
    iVar4 = Tas_ManCheckLimits(p);
    uVar6 = -(uint)(iVar4 != 0) | uVar6;
  }
  return uVar6;
}

Assistant:

int Tas_ManSolve( Tas_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pObj2 )
{
    int i, Entry, RetValue = 0;
    s_Counter2 = 0;
    Vec_IntClear( p->vModel );
    if ( pObj == Gia_ManConst0(p->pAig) || pObj2 == Gia_ManConst0(p->pAig) || pObj == Gia_Not(pObj2) )
        return 1;
    if ( pObj == Gia_ManConst1(p->pAig) && (pObj2 == NULL || pObj2 == Gia_ManConst1(p->pAig)) )
        return 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Tas_ManAssign( p, pObj, 0, NULL, NULL );
    if ( pObj2 && !Tas_VarIsAssigned(Gia_Regular(pObj2)) )
        Tas_ManAssign( p, pObj2, 0, NULL, NULL );
    if ( !Tas_ManSolve_rec(p, 0) && !Tas_ManCheckLimits(p) )
        Tas_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Tas_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    // clauses
    if ( p->nClauses > 0 )
    {
        p->pStore.iCur = 16;
        Vec_IntForEachEntry( p->vWatchLits, Entry, i )
            p->pWatches[Entry] = 0;
        Vec_IntClear( p->vWatchLits );
        p->nClauses = 0;
    }
    // activity
    Vec_IntForEachEntry( p->vActiveVars, Entry, i )
        p->pActivity[Entry] = 0.0;
    Vec_IntClear( p->vActiveVars );
    // statistics
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Tas_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}